

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

cTValue * lj_meta_lookup(lua_State *L,cTValue *o,MMS mm)

{
  uint local_44;
  cTValue *mo;
  GCtab *mt;
  MMS mm_local;
  cTValue *o_local;
  lua_State *L_local;
  
  if ((int)(o->field_4).it >> 0xf == -0xc) {
    mo = *(cTValue **)((o->u64 & 0x7fffffffffff) + 0x20);
  }
  else if ((int)(o->field_4).it >> 0xf == -0xd) {
    mo = *(cTValue **)((o->u64 & 0x7fffffffffff) + 0x20);
  }
  else {
    if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff3) {
      local_44 = 0xd;
    }
    else {
      local_44 = (int)(o->field_4).it >> 0xf ^ 0xffffffff;
    }
    mo = *(cTValue **)((L->glref).ptr64 + 0x1a8 + (ulong)(local_44 + 0x16) * 8);
  }
  if ((mo == (cTValue *)0x0) ||
     (L_local = (lua_State *)
                lj_tab_getstr((GCtab *)&mo->gcr,
                              *(GCstr **)((L->glref).ptr64 + 0x1a8 + (ulong)mm * 8)),
     (cTValue *)L_local == (cTValue *)0x0)) {
    L_local = (lua_State *)((L->glref).ptr64 + 0xf8);
  }
  return (cTValue *)L_local;
}

Assistant:

cTValue *lj_meta_lookup(lua_State *L, cTValue *o, MMS mm)
{
  GCtab *mt;
  if (tvistab(o))
    mt = tabref(tabV(o)->metatable);
  else if (tvisudata(o))
    mt = tabref(udataV(o)->metatable);
  else
    mt = tabref(basemt_obj(G(L), o));
  if (mt) {
    cTValue *mo = lj_tab_getstr(mt, mmname_str(G(L), mm));
    if (mo)
      return mo;
  }
  return niltv(L);
}